

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O0

double ON_SubDSectorType::CopyEdgeSectorCoefficient
                 (ON_SubDEdge *edge,ON_SubDVertex *vertex,double error_return_value)

{
  bool bVar1;
  uint local_30;
  int evi;
  double error_return_value_local;
  ON_SubDVertex *vertex_local;
  ON_SubDEdge *edge_local;
  
  edge_local = (ON_SubDEdge *)error_return_value;
  if ((edge != (ON_SubDEdge *)0x0) && (vertex != (ON_SubDVertex *)0x0)) {
    if (vertex == edge->m_vertex[0]) {
      local_30 = 0;
    }
    else {
      local_30 = 2;
      if (vertex == edge->m_vertex[1]) {
        local_30 = 1;
      }
    }
    if (local_30 < 2) {
      bVar1 = ON_SubDEdge::IsSmooth(edge);
      if (bVar1) {
        bVar1 = ON_SubDVertex::IsDartOrCreaseOrCorner(vertex);
        if (bVar1) {
          edge_local = (ON_SubDEdge *)edge->m_sector_coefficient[(int)local_30];
        }
        else {
          bVar1 = ON_SubDVertex::IsSmooth(vertex);
          if (bVar1) {
            edge_local = (ON_SubDEdge *)edge->m_sector_coefficient[(int)local_30];
          }
        }
      }
      else {
        bVar1 = ON_SubDEdge::IsCrease(edge);
        if (bVar1) {
          edge_local = (ON_SubDEdge *)0.0;
        }
      }
    }
  }
  return (double)edge_local;
}

Assistant:

double ON_SubDSectorType::CopyEdgeSectorCoefficient(
  const class ON_SubDEdge* edge,
  const class ON_SubDVertex* vertex,
  double error_return_value
)
{
  if ( nullptr != edge  && nullptr != vertex )
  {
    const int evi = (vertex == edge->m_vertex[0]) ? 0 : (vertex == edge->m_vertex[1] ? 1 : 2);
    if (evi < 2)
    {
      if (edge->IsSmooth())
      {
        if ( vertex->IsDartOrCreaseOrCorner() )
          return edge->m_sector_coefficient[evi];
        if ( vertex->IsSmooth() )
          return edge->m_sector_coefficient[evi];
      }
      else if ( edge->IsCrease() )
      {
        return ON_SubDSectorType::IgnoredSectorCoefficient;
      }
    }
  }

  // null pointers, unset tags, vertex and edge are not attached, 
  // or other conditions where returning a m_sector_coefficient[] 
  // is impossible or makes no sense.
  return error_return_value;
}